

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O2

boolean decode_mcu_DC_refine(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  jpeg_entropy_decoder *pjVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  pjVar1 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    iVar2 = *(int *)((long)&pjVar1[4].start_pass + 4);
    if (iVar2 == 0) {
      process_restart(cinfo);
      iVar2 = *(int *)((long)&pjVar1[4].start_pass + 4);
    }
    *(int *)((long)&pjVar1[4].start_pass + 4) = iVar2 + -1;
  }
  iVar2 = cinfo->Al;
  for (lVar4 = 0; lVar4 < cinfo->blocks_in_MCU; lVar4 = lVar4 + 1) {
    iVar3 = arith_decode(cinfo,(uchar *)&pjVar1[0x14].decode_mcu);
    if (iVar3 != 0) {
      (*MCU_data[lVar4])[0] = (*MCU_data[lVar4])[0] | (ushort)(1 << ((byte)iVar2 & 0x1f));
    }
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
decode_mcu_DC_refine (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  unsigned char *st;
  int p1, blkn;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  st = entropy->fixed_bin;	/* use fixed probability estimation */
  p1 = 1 << cinfo->Al;		/* 1 in the bit position being coded */

  /* Outer loop handles each block in the MCU */

  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    /* Encoded data is simply the next bit of the two's-complement DC value */
    if (arith_decode(cinfo, st))
      MCU_data[blkn][0][0] |= p1;
  }

  return TRUE;
}